

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveMessageType
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          Type *type)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  CppType CVar5;
  Descriptor *pDVar6;
  Field *this_00;
  LogMessage *other;
  EnumValueDescriptor *pEVar7;
  Descriptor *pDVar8;
  EnumDescriptor *pEVar9;
  SourceContext *this_01;
  stringpiece_ssize_type sVar10;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  RepeatedPtrField<google::protobuf::Option> *output;
  RepeatedPtrField<google::protobuf::Option> *output_00;
  long lVar11;
  string *psVar12;
  char *pcVar13;
  long lVar14;
  int i;
  long lVar15;
  StringPiece error_message;
  undefined1 local_110 [8];
  Status status;
  string type_name;
  LogMessage local_b0;
  string local_78;
  long local_58;
  DescriptorPoolTypeResolver *local_50;
  Type *local_48;
  LogFinisher local_39;
  FieldDescriptor *local_38;
  
  status.error_message_.field_2._8_8_ = &type_name._M_string_length;
  type_name._M_dataplus._M_p = (pointer)0x0;
  type_name._M_string_length._0_1_ = 0;
  local_50 = this;
  local_48 = type;
  ParseTypeUrl((Status *)local_110,this,type_url,
               (string *)((long)&status.error_message_.field_2 + 8));
  if (local_110._0_4_ == OK) {
    pDVar6 = DescriptorPool::FindMessageTypeByName
                       (local_50->pool_,(string *)((long)&status.error_message_.field_2 + 8));
    if (pDVar6 == (Descriptor *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                     "Invalid type URL, unknown type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&status.error_message_.field_2 + 8));
      sVar10 = StringPiece::CheckedSsizeTFromSizeT((size_t)local_b0.filename_);
      error_message.length_ = sVar10;
      error_message.ptr_ = (char *)local_b0._0_8_;
      Status::Status(__return_storage_ptr__,NOT_FOUND,error_message);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      Type::Clear(local_48);
      Type::_internal_set_name(local_48,*(string **)(pDVar6 + 8));
      type_name.field_2._8_8_ = &local_48->fields_;
      local_50 = (DescriptorPoolTypeResolver *)&local_50->url_prefix_;
      lVar11 = 0;
      for (lVar14 = 0; lVar14 < *(int *)(pDVar6 + 0x68); lVar14 = lVar14 + 1) {
        lVar15 = *(long *)(pDVar6 + 0x28);
        this_00 = RepeatedPtrField<google::protobuf::Field>::Add
                            ((RepeatedPtrField<google::protobuf::Field> *)type_name.field_2._8_8_);
        local_38 = (FieldDescriptor *)(lVar15 + lVar11);
        TVar4 = FieldDescriptor::type(local_38);
        this_00->kind_ = TVar4;
        iVar1 = *(int *)(lVar15 + 0x3c + lVar11);
        if (iVar1 - 1U < 3) {
          this_00->cardinality_ = iVar1;
        }
        this_00->number_ = *(int32 *)(lVar15 + 0x44 + lVar11);
        Field::_internal_set_name(this_00,*(string **)(lVar15 + lVar11));
        psVar12 = *(string **)(lVar15 + 0x20 + lVar11);
        Field::_internal_set_json_name(this_00,psVar12);
        if (*(char *)(lVar15 + 0x40 + lVar11) == '\x01') {
          CVar5 = FieldDescriptor::cpp_type(local_38);
          switch(CVar5) {
          case CPPTYPE_INT32:
            strings::AlphaNum::AlphaNum((AlphaNum *)&local_b0,*(int *)(lVar15 + 0x90 + lVar11));
            StrCat_abi_cxx11_(&local_78,(protobuf *)&local_b0,a);
            break;
          case CPPTYPE_INT64:
            strings::AlphaNum::AlphaNum((AlphaNum *)&local_b0,*(long *)(lVar15 + 0x90 + lVar11));
            StrCat_abi_cxx11_(&local_78,(protobuf *)&local_b0,a_02);
            break;
          case CPPTYPE_UINT32:
            strings::AlphaNum::AlphaNum((AlphaNum *)&local_b0,*(uint *)(lVar15 + 0x90 + lVar11));
            StrCat_abi_cxx11_(&local_78,(protobuf *)&local_b0,a_00);
            break;
          case CPPTYPE_UINT64:
            strings::AlphaNum::AlphaNum
                      ((AlphaNum *)&local_b0,*(unsigned_long *)(lVar15 + 0x90 + lVar11));
            StrCat_abi_cxx11_(&local_78,(protobuf *)&local_b0,a_01);
            break;
          case CPPTYPE_DOUBLE:
            SimpleDtoa_abi_cxx11_(&local_78,(protobuf *)psVar12,*(double *)(lVar15 + 0x90 + lVar11))
            ;
            break;
          case CPPTYPE_FLOAT:
            SimpleFtoa_abi_cxx11_(&local_78,(protobuf *)psVar12,*(float *)(lVar15 + 0x90 + lVar11));
            break;
          case CPPTYPE_BOOL:
            pcVar13 = "false";
            if (*(char *)(lVar15 + 0x90 + lVar11) != '\0') {
              pcVar13 = "true";
            }
            std::__cxx11::string::string((string *)&local_78,pcVar13,(allocator *)&local_b0);
            break;
          case CPPTYPE_ENUM:
            pEVar7 = FieldDescriptor::default_value_enum(local_38);
            psVar12 = *(string **)pEVar7;
LAB_00349ce4:
            std::__cxx11::string::string((string *)&local_78,(string *)psVar12);
            break;
          case CPPTYPE_STRING:
            TVar4 = FieldDescriptor::type(local_38);
            psVar12 = *(string **)(lVar15 + 0x90 + lVar11);
            if (TVar4 != TYPE_BYTES) goto LAB_00349ce4;
            CEscape(&local_78,psVar12);
            break;
          case CPPTYPE_MESSAGE:
            protobuf::internal::LogMessage::LogMessage
                      (&local_b0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/type_resolver_util.cc"
                       ,0x161);
            other = protobuf::internal::LogMessage::operator<<
                              (&local_b0,"Messages can\'t have default values!");
            protobuf::internal::LogFinisher::operator=(&local_39,other);
            protobuf::internal::LogMessage::~LogMessage(&local_b0);
          default:
            std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_b0);
          }
          Field::set_default_value(this_00,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        TVar4 = FieldDescriptor::type(local_38);
        if ((TVar4 == TYPE_MESSAGE) ||
           (TVar4 = FieldDescriptor::type(local_38), TVar4 == TYPE_GROUP)) {
          pDVar8 = FieldDescriptor::message_type(local_38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,"/");
          local_58 = lVar15;
          std::operator+(&local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (pDVar8 + 8));
          std::__cxx11::string::~string((string *)&local_b0);
          Field::set_type_url(this_00,&local_78);
LAB_00349d7e:
          std::__cxx11::string::~string((string *)&local_78);
          lVar15 = local_58;
        }
        else {
          TVar4 = FieldDescriptor::type(local_38);
          if (TVar4 == TYPE_ENUM) {
            pEVar9 = FieldDescriptor::enum_type(local_38);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50,"/");
            local_58 = lVar15;
            std::operator+(&local_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (pEVar9 + 8));
            std::__cxx11::string::~string((string *)&local_b0);
            Field::set_type_url(this_00,&local_78);
            goto LAB_00349d7e;
          }
        }
        lVar2 = *(long *)(lVar15 + 0x58 + lVar11);
        if (lVar2 != 0) {
          this_00->oneof_index_ =
               (int)((lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) / 0x30) + 1;
        }
        bVar3 = FieldDescriptor::is_packed(local_38);
        if (bVar3) {
          this_00->packed_ = true;
        }
        ConvertOptionsInternal
                  (*(DescriptorPoolTypeResolver **)(lVar15 + 0x78 + lVar11),
                   (Message *)&this_00->options_,output);
        lVar11 = lVar11 + 0x98;
      }
      lVar11 = 0;
      for (lVar14 = 0; lVar14 < *(int *)(pDVar6 + 0x6c); lVar14 = lVar14 + 1) {
        Type::add_oneofs(local_48,*(string **)(*(long *)(pDVar6 + 0x30) + lVar11));
        lVar11 = lVar11 + 0x30;
      }
      this_01 = Type::_internal_mutable_source_context(local_48);
      SourceContext::_internal_set_file_name(this_01,(string *)**(undefined8 **)(pDVar6 + 0x10));
      ConvertOptionsInternal
                (*(DescriptorPoolTypeResolver **)(pDVar6 + 0x20),(Message *)&local_48->options_,
                 output_00);
      Status::Status(__return_storage_ptr__);
    }
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_110);
  }
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::~string((string *)(status.error_message_.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Status ResolveMessageType(const std::string& type_url, Type* type) override {
    std::string type_name;
    Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const Descriptor* descriptor = pool_->FindMessageTypeByName(type_name);
    if (descriptor == NULL) {
      return Status(util::error::NOT_FOUND,
                    "Invalid type URL, unknown type: " + type_name);
    }
    ConvertDescriptor(descriptor, type);
    return Status();
  }